

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultIoResolverBase::resolveSet
          (TDefaultIoResolverBase *this,EShLanguage stage,TVarEntryInfo *ent)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TQualifier *this_00;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  char *__nptr;
  TType *type;
  TVarEntryInfo *ent_local;
  EShLanguage stage_local;
  TDefaultIoResolverBase *this_local;
  
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
  bVar1 = TQualifier::hasSet(this_00);
  if (bVar1) {
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
    this_local._4_4_ = (uint)(*(ulong *)(lVar3 + 0x1c) >> 0xf) & 0x7f;
    ent->newSet = this_local._4_4_;
  }
  else {
    pvVar4 = getResourceSetBinding_abi_cxx11_(this,stage);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar4);
    if (sVar5 == 1) {
      pvVar4 = getResourceSetBinding_abi_cxx11_(this,stage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar4,0);
      __nptr = (char *)std::__cxx11::string::c_str();
      this_local._4_4_ = atoi(__nptr);
      ent->newSet = this_local._4_4_;
    }
    else {
      ent->newSet = 0;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int TDefaultIoResolverBase::resolveSet(EShLanguage stage, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    if (type.getQualifier().hasSet()) {
        return ent.newSet = type.getQualifier().layoutSet;
    }
    // If a command line or API option requested a single descriptor set, use that (if not overrided by spaceN)
    if (getResourceSetBinding(stage).size() == 1) {
        return ent.newSet = atoi(getResourceSetBinding(stage)[0].c_str());
    }
    return ent.newSet = 0;
}